

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AsyncQueue.h
# Opt level: O0

void __thiscall
nrg::detail::AsyncQueue<nrg::PrioExecution>::operator()
          (AsyncQueue<nrg::PrioExecution> *this,
          _func_void_AsyncResult<int>_AsyncResult<int>_AsyncResult<int>_int *param,
          AsyncResult<int> *param_2,AsyncResult<int> *param_3,AsyncResult<int> *param_4,int *param_5
          )

{
  lock_guard<std::mutex> local_40;
  lock_guard<std::mutex> lock;
  int *param_local_4;
  AsyncResult<int> *param_local_3;
  AsyncResult<int> *param_local_2;
  AsyncResult<int> *param_local_1;
  _func_void_AsyncResult<int>_AsyncResult<int>_AsyncResult<int>_int *param_local;
  AsyncQueue<nrg::PrioExecution> *this_local;
  
  lock._M_device = (mutex_type *)param_5;
  std::lock_guard<std::mutex>::lock_guard(&local_40,&this->guard_);
  PrioExecution::
  push<void(*)(nrg::AsyncResult<int>,nrg::AsyncResult<int>,nrg::AsyncResult<int>,int),nrg::AsyncResult<int>&,nrg::AsyncResult<int>&,nrg::AsyncResult<int>&,int>
            (&this->queue_,param,param_2,param_3,param_4,(int *)lock._M_device);
  std::condition_variable::notify_one();
  std::lock_guard<std::mutex>::~lock_guard(&local_40);
  return;
}

Assistant:

void operator()(Param&&... param)
    {
        std::lock_guard<std::mutex> lock(guard_);
        AsyncStyle::push(queue_, std::forward<Param>(param)...);
        cond_.notify_one();
    }